

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O3

void slab_cache_destroy(slab_cache *cache)

{
  rlist *prVar1;
  rlist *prVar2;
  quota *pqVar3;
  ulong uVar4;
  rlist *ptr;
  uint uVar5;
  bool bVar6;
  
  ptr = (cache->allocated).slabs.next;
  while( true ) {
    while( true ) {
      if (((slab_list *)ptr == &cache->allocated) || (prVar1 = ptr->next, prVar1 == (rlist *)0x0)) {
        return;
      }
      if (cache->order_max + 1 == (uint)*(byte *)((long)&ptr[2].next + 4)) break;
      slab_unmap(cache->arena,ptr);
      ptr = prVar1;
    }
    prVar2 = ptr[2].prev;
    if ((rlist *)0x3fffffffbff < prVar2) {
      __assert_fail("size < QUOTA_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
    }
    if (prVar2 == (rlist *)0x0) break;
    pqVar3 = cache->arena->quota;
    do {
      uVar4 = pqVar3->value;
      uVar5 = (uint)((ulong)((long)&prVar2[0x3f].next + 7U) >> 10);
      if ((uint)uVar4 < uVar5) {
        __assert_fail("size_in_units <= used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0xab,"ssize_t quota_release(struct quota *, size_t)");
      }
      LOCK();
      bVar6 = uVar4 == pqVar3->value;
      if (bVar6) {
        pqVar3->value = (ulong)((uint)uVar4 - uVar5) | uVar4 & 0xffffffff00000000;
      }
      UNLOCK();
    } while (!bVar6);
    free(ptr);
    ptr = prVar1;
  }
  __assert_fail("size_in_units",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                ,0xa5,"ssize_t quota_release(struct quota *, size_t)");
}

Assistant:

void
slab_cache_destroy(struct slab_cache *cache)
{
	struct rlist *slabs = &cache->allocated.slabs;
	/*
	 * cache->allocated contains huge allocations and
	 * slabs of the largest order. All smaller slabs are
	 * obtained from larger slabs by splitting.
	 */
	struct slab *slab, *tmp;
	rlist_foreach_entry_safe(slab, slabs, next_in_cache, tmp) {
		if (slab->order == cache->order_max + 1) {
			size_t slab_size = slab->size;
			quota_release(cache->arena->quota, slab_size);
			VALGRIND_MEMPOOL_FREE(cache, slab_data(slab));
			free(slab);
		} else {
			slab_unmap(cache->arena, slab);
		}
	}


	VALGRIND_DESTROY_MEMPOOL(cache);
}